

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

bool slang::ast::Lookup::findAssertionLocalVar
               (ASTContext *context,NameSyntax *syntax,LookupResult *result)

{
  group_type_pointer pgVar1;
  char *pcVar2;
  value_type_pointer ppVar3;
  uint uVar4;
  byte bVar5;
  NameComponents name;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  size_t __n;
  AssertionInstanceDetails *pAVar6;
  bool bVar7;
  SyntaxKind SVar8;
  int iVar9;
  uint uVar10;
  AssertionInstanceDetails *pAVar11;
  uint64_t uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  size_type __rlen;
  undefined1 auVar16 [16];
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  byte bVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  int colonParts;
  size_t pos;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  int local_244;
  ulong local_240;
  ulong local_238;
  group_type_pointer local_230;
  ASTContext *local_228;
  LookupResult *local_220;
  ulong local_218;
  char *local_210;
  basic_string_view<char,_std::char_traits<char>_> local_208;
  SourceLocation local_1f8;
  SourceLocation SStack_1f0;
  pointer local_1e8;
  size_t sStack_1e0;
  ParameterValueAssignmentSyntax *local_1d8;
  uchar local_1c8;
  uchar uStack_1c7;
  uchar uStack_1c6;
  byte bStack_1c5;
  uchar uStack_1c4;
  uchar uStack_1c3;
  uchar uStack_1c2;
  byte bStack_1c1;
  uchar uStack_1c0;
  uchar uStack_1bf;
  uchar uStack_1be;
  byte bStack_1bd;
  uchar uStack_1bc;
  uchar uStack_1bb;
  uchar uStack_1ba;
  byte bStack_1b9;
  uchar local_1b8;
  uchar uStack_1b7;
  uchar uStack_1b6;
  byte bStack_1b5;
  uchar uStack_1b4;
  uchar uStack_1b3;
  uchar uStack_1b2;
  byte bStack_1b1;
  uchar uStack_1b0;
  uchar uStack_1af;
  uchar uStack_1ae;
  byte bStack_1ad;
  uchar uStack_1ac;
  uchar uStack_1ab;
  uchar uStack_1aa;
  byte bStack_1a9;
  NameComponents local_1a0;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> local_168 [3];
  
  local_244 = 0;
  pcVar2 = local_168[0].firstElement;
  local_168[0].len = 0;
  local_168[0].cap = 4;
  SVar8 = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
  local_168[0].data_ = (pointer)pcVar2;
  if (SVar8 == ScopedName) {
    syntax = anon_unknown_39::splitScopedName((ScopedNameSyntax *)syntax,local_168,&local_244);
    if (local_244 == 0) {
      SVar8 = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
      goto LAB_0085bd84;
    }
  }
  else {
LAB_0085bd84:
    if ((SVar8 - IdentifierName < 2) || (SVar8 == ClassName)) {
      anon_unknown_39::NameComponents::NameComponents(&local_1a0,syntax);
      local_1d8 = local_1a0.paramAssignments;
      local_1e8 = local_1a0.selectors._M_ptr;
      sStack_1e0 = local_1a0.selectors._M_extent._M_extent_value;
      local_1f8 = local_1a0.range.startLoc;
      SStack_1f0 = local_1a0.range.endLoc;
      local_208._M_len = local_1a0.text._M_len;
      local_208._M_str = local_1a0.text._M_str;
      pAVar6 = context->assertionInstance;
      do {
        pAVar11 = pAVar6;
        pAVar6 = pAVar11->argDetails;
      } while (pAVar11->argDetails != (AssertionInstanceDetails *)0x0);
      local_228 = context;
      local_220 = result;
      uVar12 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          &pAVar11->localVars,&local_208);
      __n = local_208._M_len;
      uVar14 = uVar12 >> ((byte)(pAVar11->localVars).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                                .arrays.groups_size_index & 0x3f);
      local_230 = (pAVar11->localVars).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                  .arrays.groups_;
      lVar15 = (uVar12 & 0xff) * 4;
      uVar17 = (&UNK_0092f4ac)[lVar15];
      uVar18 = (&UNK_0092f4ad)[lVar15];
      uVar19 = (&UNK_0092f4ae)[lVar15];
      bVar20 = (&UNK_0092f4af)[lVar15];
      local_210 = local_208._M_str;
      local_218 = (ulong)((uint)uVar12 & 7);
      local_240 = 0;
      uVar21 = uVar17;
      uVar22 = uVar18;
      uVar23 = uVar19;
      bVar24 = bVar20;
      uVar25 = uVar17;
      uVar26 = uVar18;
      uVar27 = uVar19;
      bVar28 = bVar20;
      uVar29 = uVar17;
      uVar30 = uVar18;
      uVar31 = uVar19;
      bVar32 = bVar20;
      do {
        pgVar1 = local_230 + uVar14;
        local_1b8 = pgVar1->m[0].n;
        uStack_1b7 = pgVar1->m[1].n;
        uStack_1b6 = pgVar1->m[2].n;
        bStack_1b5 = pgVar1->m[3].n;
        uStack_1b4 = pgVar1->m[4].n;
        uStack_1b3 = pgVar1->m[5].n;
        uStack_1b2 = pgVar1->m[6].n;
        bStack_1b1 = pgVar1->m[7].n;
        uStack_1b0 = pgVar1->m[8].n;
        uStack_1af = pgVar1->m[9].n;
        uStack_1ae = pgVar1->m[10].n;
        bStack_1ad = pgVar1->m[0xb].n;
        uStack_1ac = pgVar1->m[0xc].n;
        uStack_1ab = pgVar1->m[0xd].n;
        uStack_1aa = pgVar1->m[0xe].n;
        bVar5 = pgVar1->m[0xf].n;
        auVar16[0] = -(local_1b8 == uVar17);
        auVar16[1] = -(uStack_1b7 == uVar18);
        auVar16[2] = -(uStack_1b6 == uVar19);
        auVar16[3] = -(bStack_1b5 == bVar20);
        auVar16[4] = -(uStack_1b4 == uVar21);
        auVar16[5] = -(uStack_1b3 == uVar22);
        auVar16[6] = -(uStack_1b2 == uVar23);
        auVar16[7] = -(bStack_1b1 == bVar24);
        auVar16[8] = -(uStack_1b0 == uVar25);
        auVar16[9] = -(uStack_1af == uVar26);
        auVar16[10] = -(uStack_1ae == uVar27);
        auVar16[0xb] = -(bStack_1ad == bVar28);
        auVar16[0xc] = -(uStack_1ac == uVar29);
        auVar16[0xd] = -(uStack_1ab == uVar30);
        auVar16[0xe] = -(uStack_1aa == uVar31);
        auVar16[0xf] = -(bVar5 == bVar32);
        uVar10 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
        local_238 = uVar14;
        bStack_1a9 = bVar5;
        if (uVar10 != 0) {
          ppVar3 = (pAVar11->localVars).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                   .arrays.elements_;
          local_1c8 = uVar17;
          uStack_1c7 = uVar18;
          uStack_1c6 = uVar19;
          bStack_1c5 = bVar20;
          uStack_1c4 = uVar21;
          uStack_1c3 = uVar22;
          uStack_1c2 = uVar23;
          bStack_1c1 = bVar24;
          uStack_1c0 = uVar25;
          uStack_1bf = uVar26;
          uStack_1be = uVar27;
          bStack_1bd = bVar28;
          uStack_1bc = uVar29;
          uStack_1bb = uVar30;
          uStack_1ba = uVar31;
          bStack_1b9 = bVar32;
          do {
            uVar4 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            uVar13 = (ulong)uVar4;
            if ((__n == ppVar3[uVar14 * 0xf + uVar13].first._M_len) &&
               ((__n == 0 ||
                (iVar9 = bcmp(local_210,ppVar3[uVar14 * 0xf + uVar13].first._M_str,__n),
                uVar17 = local_1c8, uVar18 = uStack_1c7, uVar19 = uStack_1c6, bVar20 = bStack_1c5,
                uVar21 = uStack_1c4, uVar22 = uStack_1c3, uVar23 = uStack_1c2, bVar24 = bStack_1c1,
                uVar25 = uStack_1c0, uVar26 = uStack_1bf, uVar27 = uStack_1be, bVar28 = bStack_1bd,
                uVar29 = uStack_1bc, uVar30 = uStack_1bb, uVar31 = uStack_1ba, bVar32 = bStack_1b9,
                iVar9 == 0)))) {
              local_220->found = ppVar3[uVar14 * 0xf + uVar13].second;
              nameParts_00._M_extent._M_extent_value = local_168[0].len;
              nameParts_00._M_ptr = local_168[0].data_;
              name.text._M_str = local_208._M_str;
              name.text._M_len = local_208._M_len;
              name.range.startLoc = local_1f8;
              name.range.endLoc = SStack_1f0;
              name.selectors._M_ptr = local_1e8;
              name.selectors._M_extent._M_extent_value = sStack_1e0;
              name.paramAssignments = local_1d8;
              bVar7 = anon_unknown_39::lookupDownward
                                (nameParts_00,name,local_228,(bitmask<slang::ast::LookupFlags>)0x0,
                                 local_220);
              goto LAB_0085bd96;
            }
            uVar10 = uVar10 - 1 & uVar10;
          } while (uVar10 != 0);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[local_218] & bVar5) == 0)
        goto LAB_0085bd94;
        uVar13 = (pAVar11->localVars).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                 .arrays.groups_size_mask;
        lVar15 = local_238 + local_240;
        local_240 = local_240 + 1;
        uVar14 = lVar15 + 1U & uVar13;
        bVar7 = false;
      } while (local_240 <= uVar13);
      goto LAB_0085bd96;
    }
  }
LAB_0085bd94:
  bVar7 = false;
LAB_0085bd96:
  if (local_168[0].data_ != (pointer)pcVar2) {
    operator_delete(local_168[0].data_);
  }
  return bVar7;
}

Assistant:

bool Lookup::findAssertionLocalVar(const ASTContext& context, const NameSyntax& syntax,
                                   LookupResult& result) {
    int colonParts = 0;
    SmallVector<NamePlusLoc, 4> nameParts;
    const NameSyntax* first = &syntax;
    if (syntax.kind == SyntaxKind::ScopedName) {
        first = splitScopedName(syntax.as<ScopedNameSyntax>(), nameParts, colonParts);
        if (colonParts)
            return false;
    }

    NameComponents name;
    switch (first->kind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            name = *first;
            break;
        default:
            return false;
    }

    auto inst = context.assertionInstance;
    SLANG_ASSERT(inst);

    while (inst->argDetails)
        inst = inst->argDetails;

    auto& map = inst->localVars;
    auto it = map.find(name.text);
    if (it == map.end())
        return false;

    result.found = it->second;
    return lookupDownward(nameParts, name, context, LookupFlags::None, result);
}